

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.h
# Opt level: O0

void __thiscall
cfd::core::DescriptorScriptReference::~DescriptorScriptReference(DescriptorScriptReference *this)

{
  DescriptorScriptReference *this_local;
  
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  ~vector(&this->addr_prefixes_);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector(&this->keys_);
  ::std::shared_ptr<cfd::core::DescriptorScriptReference>::~shared_ptr(&this->child_script_);
  TaprootScriptTree::~TaprootScriptTree(&this->script_tree_);
  TapBranch::~TapBranch(&this->tapbranch_);
  core::Address::~Address(&this->address_script_);
  Script::~Script(&this->redeem_script_);
  Script::~Script(&this->locking_script_);
  return;
}

Assistant:

class CFD_CORE_EXPORT DescriptorScriptReference {
 public:
  /**
   * @brief constructor.
   */
  DescriptorScriptReference();
  /**
   * @brief constructor.
   * @details `raw` type only.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @details `sh` or `wsh` type only.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] child_script      child script node
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const DescriptorScriptReference& child_script,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] key_list          key(pubkey, extprivkey, extpubkey) list
   * @param[in] address_prefixes  address prefix list
   * @param[in] req_sig_num       multisig require signature num
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<DescriptorKeyReference>& key_list,
      const std::vector<AddressFormatData>& address_prefixes,
      const uint32_t req_sig_num = 0);
  /**
   * @brief constructor.
   * @param[in] address_script    address script
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Address& address_script,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] key_list          key(pubkey, extprivkey, extpubkey) list
   * @param[in] tapbranch         taproot tapbranch
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<DescriptorKeyReference>& key_list,
      const TapBranch& tapbranch,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief constructor.
   * @param[in] locking_script    locking script
   * @param[in] script_type       script type
   * @param[in] key_list          key(pubkey, extprivkey, extpubkey) list
   * @param[in] script_tree       taproot script tree
   * @param[in] address_prefixes  address prefix list
   */
  explicit DescriptorScriptReference(
      const Script& locking_script, DescriptorScriptType script_type,
      const std::vector<DescriptorKeyReference>& key_list,
      const TaprootScriptTree& script_tree,
      const std::vector<AddressFormatData>& address_prefixes);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorScriptReference object
   */
  DescriptorScriptReference(const DescriptorScriptReference& object);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorScriptReference object
   * @return DescriptorScriptReference object
   */
  DescriptorScriptReference& operator=(
      const DescriptorScriptReference& object);

  /**
   * @brief getting locking script.
   * @return locking script
   */
  Script GetLockingScript() const;
  /**
   * @brief exist address data.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasAddress() const;
  /**
   * @brief getting address.
   * @param[in] net_type    network type
   * @return address
   */
  Address GenerateAddress(NetType net_type) const;
  /**
   * @brief getting address list.
   * @param[in] net_type    network type
   * @return address list
   */
  std::vector<Address> GenerateAddresses(NetType net_type) const;
  /**
   * @brief getting address type.
   * @return address type
   */
  AddressType GetAddressType() const;
  /**
   * @brief getting hash type.
   * @return hash type
   */
  HashType GetHashType() const;

  // script api
  /**
   * @brief exist redeem script.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasRedeemScript() const;
  /**
   * @brief getting redeem script.
   * @return redeem script
   */
  Script GetRedeemScript() const;
  /**
   * @brief exist child script node.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasChild() const;
  /**
   * @brief getting child script node.
   * @return child script node
   */
  DescriptorScriptReference GetChild() const;
  /**
   * @brief exists multisig require signature num.
   * @retval true exist
   * @retval false not exist
   */
  bool HasReqNum() const;
  /**
   * @brief getting multisig require signature num.
   * @return require signature num
   */
  uint32_t GetReqNum() const;

  // key api
  /**
   * @brief exist key list.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasKey() const;
  /**
   * @brief getting key list number.
   * @return key list number
   */
  uint32_t GetKeyNum() const;
  /**
   * @brief getting key list.
   * @return key list
   */
  std::vector<DescriptorKeyReference> GetKeyList() const;

  // taproot api
  /**
   * @brief exist taproot tapbranch.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasTapBranch() const;
  /**
   * @brief getting taproot tapbranch.
   * @return tapbranch
   */
  TapBranch GetTapBranch() const;
  /**
   * @brief exist taproot script tree.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasScriptTree() const;
  /**
   * @brief getting taproot script tree.
   * @return taproot script tree
   */
  TaprootScriptTree GetScriptTree() const;

  /**
   * @brief getting script type.
   * @return script type
   */
  DescriptorScriptType GetScriptType() const;

 private:
  DescriptorScriptType script_type_;  //!< node script type
  Script locking_script_;             //!< locking script
  bool is_script_;                    //!< exist redeem script
  Script redeem_script_;              //!< redeem script
  Address address_script_;            //!< address script data
  uint32_t req_num_;                  //!< multisig require signature number
  TapBranch tapbranch_;               //!< taproot branch
  bool is_tapbranch_;                 //!< exist tapbranch
  TaprootScriptTree script_tree_;     //!< taproot script tree
  //! child script
  std::shared_ptr<DescriptorScriptReference> child_script_ = nullptr;
  std::vector<DescriptorKeyReference> keys_;      //!< key list
  std::vector<AddressFormatData> addr_prefixes_;  //!< address prefixes
}